

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other.cpp
# Opt level: O2

void another_file(string *path,string *DLL_file)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  int ierr_1;
  int ierr;
  char *local_2db8;
  double h;
  double d;
  int nc;
  string err;
  double w;
  double q;
  double cv;
  double cp;
  double u;
  double s;
  double dv;
  double dl;
  double p;
  double T;
  double y [20];
  double x [20];
  char herr_1 [255];
  char herr [255];
  double z [20];
  char href [255];
  char hhmx [255];
  char hfld [10000];
  
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  bVar2 = load_REFPROP(&err,path,DLL_file);
  local_2db8 = "false";
  if (bVar2) {
    local_2db8 = "true";
  }
  sVar3 = REFPROP_address();
  printf("Loaded refprop (in other.cpp): %s @ address %zu\n",local_2db8,sVar3);
  (*(code *)SETPATHdll)((path->_M_dataplus)._M_p,400);
  ierr = 0;
  nc = 1;
  memcpy(hfld,"R32.FLD",10000);
  memcpy(hhmx,"HMX.BNC",0xff);
  memset(href,0,0xff);
  href[0] = 'D';
  href[1] = 'E';
  href[2] = 'F';
  (*(code *)SETUPdll)(&nc,hfld,hhmx,href,&ierr,herr,10000,0xff,3,0xff);
  if (0 < ierr) {
    printf("Other ierr: %ld herr: %s\n",(ulong)(uint)ierr,herr);
  }
  memset(z,0,0xa0);
  z[0] = 1.0;
  memset(x,0,0xa0);
  x[0] = 1.0;
  memset(y,0,0xa0);
  y[0] = 1.0;
  T = 300.0;
  p = 101.325;
  d = -1.0;
  h = -1.0;
  (*(code *)TPFLSHdll)(&T,&p,z);
  pcVar1 = local_2db8;
  printf("Other d: %g mol/L\n",d);
  unload_REFPROP(&err);
  printf("Unloaded refprop (in other.cpp): %s\n",pcVar1);
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

void another_file(const std::string & path, const std::string &DLL_file)
{

    // Load the shared library
    std::string err;
    bool loaded_REFPROP = load_REFPROP(err, path, DLL_file);
    printf("Loaded refprop (in other.cpp): %s @ address %zu\n", loaded_REFPROP ? "true" : "false", REFPROP_address());

    // Set the loading path
    SETPATHdll(const_cast<char*>(path.c_str()), 400);

    int ierr = 0, nc = 1;
    char herr[255], hfld[10000] = "R32.FLD", hhmx[255] = "HMX.BNC", href[255] = "DEF";
    SETUPdll(nc,hfld,hhmx,href,ierr,herr,10000,255,3,255);
    if (ierr > 0) printf("Other ierr: %ld herr: %s\n", ierr, herr);
    {
        int ierr = 0;
        char herr[255];
        double z[20] = {1.0}, x[20] = {1.0}, y[20] = {1.0}, T= 300, p = 101.325, d = -1, dl = -1, dv = -1, h = -1, s = -1, u = -1, cp = -1, cv = -1, q = -1, w = -1;
        TPFLSHdll(T, p, z, d, dl, dv, x, y, h,s,u,cp,cv,w,q,ierr,herr,255);
        if (ierr > 0) printf("Other ierr: %ld herr: %s\n", ierr, herr);
        printf("Other d: %g mol/L\n", d);
    }

    bool unloaded_REFPROP = unload_REFPROP(err);
    printf("Unloaded refprop (in other.cpp): %s\n", loaded_REFPROP ? "true" : "false");
}